

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
OneLevel_UpsertIteration_Test::~OneLevel_UpsertIteration_Test(OneLevel_UpsertIteration_Test *this)

{
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__OneLevel_0026d770;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_OneLevel).index_);
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_0026d6b0;
  pstore::database::~database
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_);
  in_memory_store::~in_memory_store
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (OneLevel, UpsertIteration) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "c");
    this->insert_or_assign (*index_, t1, "d");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "b");

    // Check trie iterator in the heap.
    test_trie::iterator begin = itp.first;
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const v1 = (*begin).first;
    EXPECT_EQ ("b", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("a", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    std::string const & v4 = (*begin).first;
    EXPECT_EQ ("d", v4);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());
    itp = this->insert_or_assign (*index_, t1, "b");
    begin = itp.first;

    std::string const v5 = begin->first;
    EXPECT_EQ ("b", v5);
    ++begin;
    std::string const v6 = begin->first;
    EXPECT_EQ ("a", v6);
    ++begin;
    std::string const v7 = begin->first;
    EXPECT_EQ ("c", v7);
    ++begin;
    std::string const v8 = begin->first;
    EXPECT_EQ ("d", v8);
    ++begin;
    EXPECT_EQ (begin, end);
}